

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbenchmarkperfevents.cpp
# Opt level: O0

void __thiscall QBenchmarkPerfEventsMeasurer::start(QBenchmarkPerfEventsMeasurer *this)

{
  bool bVar1;
  Type *this_00;
  const_iterator o;
  PerfEvent *pPVar2;
  const_iterator o_00;
  int *piVar3;
  QList<PerfEvent> *in_RDI;
  long in_FS_OFFSET;
  int fd_1;
  add_const_t<QList<int>_> *__range1;
  int fd;
  add_const_t<QList<PerfEvent>_> *__range2;
  int flags;
  int group_fd;
  int cpu;
  pid_t pid;
  QList<PerfEvent> *counters;
  const_iterator __end1;
  const_iterator __begin1;
  PerfEvent counter;
  const_iterator __end2;
  const_iterator __begin2;
  perf_event_attr attr;
  QList<PerfEvent> *in_stack_fffffffffffffec8;
  PerfEvent **flags_00;
  int in_stack_fffffffffffffed8;
  pid_t in_stack_fffffffffffffedc;
  perf_event_attr *in_stack_fffffffffffffee0;
  int local_114;
  undefined4 uVar4;
  undefined4 uVar5;
  const_iterator local_d8;
  undefined1 *local_d0;
  qsizetype in_stack_ffffffffffffff38;
  const_iterator local_b0 [4];
  undefined4 local_90;
  undefined4 local_8c;
  quint64 local_88;
  undefined8 local_70;
  ulong local_68;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_90,0,0x88);
  local_8c = 0x88;
  local_70 = 3;
  local_68 = CONCAT62(local_68._2_6_,0x2807);
  this_00 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_eventTypes>_>::
            operator*((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_eventTypes>_>
                       *)0x123c31);
  bVar1 = QList<PerfEvent>::isEmpty((QList<PerfEvent> *)0x123c40);
  if (bVar1) {
    defaultCounters();
    QList<PerfEvent>::operator=(in_RDI,in_stack_fffffffffffffec8);
    QList<PerfEvent>::~QList((QList<PerfEvent> *)0x123c72);
  }
  bVar1 = QList<int>::isEmpty((QList<int> *)0x123c80);
  if (bVar1) {
    uVar5 = 0xffffffff;
    uVar4 = 8;
    flags_00 = &(in_RDI->d).ptr;
    QList<PerfEvent>::size(this_00);
    QList<int>::reserve((QList<int> *)CONCAT44(uVar5,uVar4),in_stack_ffffffffffffff38);
    local_b0[0].i = (PerfEvent *)&DAT_aaaaaaaaaaaaaaaa;
    local_b0[0] = QList<PerfEvent>::begin(in_RDI);
    o = QList<PerfEvent>::end(in_RDI);
    while (bVar1 = QList<PerfEvent>::const_iterator::operator!=(local_b0,o), bVar1) {
      local_d0 = &DAT_aaaaaaaaaaaaaaaa;
      pPVar2 = QList<PerfEvent>::const_iterator::operator*(local_b0);
      local_d0 = *(undefined1 **)pPVar2;
      local_88 = pPVar2->config;
      local_90 = local_d0._0_4_;
      local_114 = perf_event_open(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,
                                  in_stack_fffffffffffffed8,(int)((ulong)in_RDI >> 0x20),
                                  (unsigned_long)flags_00);
      if (local_114 == -1) {
        local_68 = local_68 & 0xffffffffffffff9f | 0x60;
        local_114 = perf_event_open(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,
                                    in_stack_fffffffffffffed8,(int)((ulong)in_RDI >> 0x20),
                                    (unsigned_long)flags_00);
      }
      if (local_114 == -1) {
        perror("QBenchmarkPerfEventsMeasurer::start: perf_event_open");
        exit(1);
      }
      QList<int>::append((QList<int> *)0x123e47,(parameter_type)((ulong)flags_00 >> 0x20));
      QList<PerfEvent>::const_iterator::operator++(local_b0);
    }
  }
  local_d8.i = (int *)&DAT_aaaaaaaaaaaaaaaa;
  local_d8 = QList<int>::begin((QList<int> *)in_RDI);
  o_00 = QList<int>::end((QList<int> *)in_RDI);
  while (bVar1 = QList<int>::const_iterator::operator!=(&local_d8,o_00), bVar1) {
    piVar3 = QList<int>::const_iterator::operator*(&local_d8);
    ioctl(*piVar3,0x2403);
    QList<int>::const_iterator::operator++(&local_d8);
  }
  prctl(0x20);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QBenchmarkPerfEventsMeasurer::start()
{
    QT_WARNING_DISABLE_GCC("-Wmissing-field-initializers")
    QT_WARNING_DISABLE_CLANG("-Wmissing-field-initializers")
    perf_event_attr attr = {
        .size = sizeof attr,
        .read_format = PERF_FORMAT_TOTAL_TIME_ENABLED | PERF_FORMAT_TOTAL_TIME_RUNNING,
        .disabled = true,       // we'll enable later
        .inherit = true,        // let children processes inherit the monitoring
        .pinned = true,         // keep it running in the hardware
        .inherit_stat = true,   // aggregate all the info from child processes
        .task = true,           // trace fork/exits
    };

    QList<PerfEvent> &counters = *eventTypes;
    if (counters.isEmpty())
        counters = defaultCounters();
    if (fds.isEmpty()) {
        pid_t pid = 0;      // attach to the current process only
        int cpu = -1;       // on any CPU
        int group_fd = -1;
        int flags = PERF_FLAG_FD_CLOEXEC;

        fds.reserve(counters.size());
        for (PerfEvent counter : std::as_const(counters)) {
            attr.type = counter.type;
            attr.config = counter.config;
            int fd = perf_event_open(&attr, pid, cpu, group_fd, flags);
            if (fd == -1) {
                // probably a paranoid kernel (/proc/sys/kernel/perf_event_paranoid)
                attr.exclude_kernel = true;
                attr.exclude_hv = true;
                fd = perf_event_open(&attr, pid, cpu, group_fd, flags);
            }
            if (fd == -1) {
                perror("QBenchmarkPerfEventsMeasurer::start: perf_event_open");
                exit(1);
            }

            fds.append(fd);
        }
    }

    // enable the counters
    for (int fd : std::as_const(fds))
        ::ioctl(fd, PERF_EVENT_IOC_RESET);
    prctl(PR_TASK_PERF_EVENTS_ENABLE);
}